

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

_Bool IsWindowContentHoverable(ImGuiWindow_conflict *window,ImGuiHoveredFlags flags)

{
  ImGuiWindow_conflict *pIVar1;
  ImGuiWindow_conflict *focused_root_window;
  ImGuiContext_conflict *g;
  ImGuiHoveredFlags flags_local;
  ImGuiWindow_conflict *window_local;
  
  if ((((GImGui->NavWindow != (ImGuiWindow_conflict *)0x0) &&
       (pIVar1 = GImGui->NavWindow->RootWindowDockTree, pIVar1 != (ImGuiWindow_conflict *)0x0)) &&
      ((pIVar1->WasActive & 1U) != 0)) && (pIVar1 != window->RootWindowDockTree)) {
    if ((pIVar1->Flags & 0x8000000U) != 0) {
      return false;
    }
    if (((pIVar1->Flags & 0x4000000U) != 0) && ((flags & 0x20U) == 0)) {
      return false;
    }
  }
  if ((window->Viewport == GImGui->MouseViewport) ||
     ((GImGui->MovingWindow != (ImGuiWindow_conflict *)0x0 &&
      (window->RootWindowDockTree == GImGui->MovingWindow->RootWindowDockTree)))) {
    window_local._7_1_ = true;
  }
  else {
    window_local._7_1_ = false;
  }
  return window_local._7_1_;
}

Assistant:

static inline bool IsWindowContentHoverable(ImGuiWindow* window, ImGuiHoveredFlags flags)
{
    // An active popup disable hovering on other windows (apart from its own children)
    // FIXME-OPT: This could be cached/stored within the window.
    ImGuiContext& g = *GImGui;
    if (g.NavWindow)
        if (ImGuiWindow* focused_root_window = g.NavWindow->RootWindowDockTree)
            if (focused_root_window->WasActive && focused_root_window != window->RootWindowDockTree)
            {
                // For the purpose of those flags we differentiate "standard popup" from "modal popup"
                // NB: The order of those two tests is important because Modal windows are also Popups.
                if (focused_root_window->Flags & ImGuiWindowFlags_Modal)
                    return false;
                if ((focused_root_window->Flags & ImGuiWindowFlags_Popup) && !(flags & ImGuiHoveredFlags_AllowWhenBlockedByPopup))
                    return false;
            }

    // Filter by viewport
    if (window->Viewport != g.MouseViewport)
        if (g.MovingWindow == NULL || window->RootWindowDockTree != g.MovingWindow->RootWindowDockTree)
            return false;

    return true;
}